

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O3

LockResult util::LockDirectory(path *directory,path *lockfile_name,bool probe_only)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string_view source_file;
  bool bVar3;
  const_iterator cVar4;
  FILE *__stream;
  FileLock *this;
  Logger *pLVar5;
  LockResult LVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  __single_object lock;
  UniqueLock<GlobalMutex> criticalblock0;
  path pathLockFile;
  string log_msg;
  _Head_base<0UL,_fsbridge::FileLock_*,_false> local_188 [2];
  unique_lock<std::mutex> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long *local_148 [2];
  long local_138 [2];
  path local_128;
  path local_100 [3];
  string local_78;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_178._M_device = (mutex_type *)&cs_dir_locks;
  local_178._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_178);
  std::filesystem::__cxx11::path::path(&local_128,&directory->super_path);
  std::filesystem::__cxx11::path::operator/=(&local_128,&lockfile_name->super_path);
  std::filesystem::__cxx11::path::path(local_100,&local_128);
  std::filesystem::__cxx11::path::~path(&local_128);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,local_100[0]._M_pathname._M_dataplus._M_p,
             local_100[0]._M_pathname._M_dataplus._M_p + local_100[0]._M_pathname._M_string_length);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>_>
          ::find(&dir_locks_abi_cxx11_._M_t,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  LVar6 = Success;
  if ((_Rb_tree_header *)cVar4._M_node == &dir_locks_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    __stream = fsbridge::fopen((char *)local_100,"a");
    if (__stream == (FILE *)0x0) {
      LVar6 = ErrorWrite;
    }
    else {
      fclose(__stream);
      this = (FileLock *)operator_new(0x28);
      fsbridge::FileLock::FileLock(this,(path *)local_100);
      local_188[0]._M_head_impl = this;
      bVar3 = fsbridge::FileLock::TryLock(this);
      if (bVar3) {
        LVar6 = Success;
        if (!probe_only) {
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,local_100[0]._M_pathname._M_dataplus._M_p,
                     local_100[0]._M_pathname._M_dataplus._M_p +
                     local_100[0]._M_pathname._M_string_length);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>>
          ::
          _M_emplace_unique<std::__cxx11::string,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>>
                      *)&dir_locks_abi_cxx11_,&local_58,
                     (unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_> *)
                     local_188);
          LVar6 = Success;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        pcVar2 = (directory->super_path)._M_pathname._M_dataplus._M_p;
        local_148[0] = local_138;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,pcVar2,
                   pcVar2 + (directory->super_path)._M_pathname._M_string_length);
        pcVar2 = ((local_188[0]._M_head_impl)->reason)._M_dataplus._M_p;
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,pcVar2,
                   pcVar2 + ((local_188[0]._M_head_impl)->reason)._M_string_length);
        pLVar5 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar5);
        if (bVar3) {
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          local_58._M_dataplus._M_p = (pointer)paVar1;
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_78,(tinyformat *)"Error while attempting to lock directory %s: %s\n",
                     (char *)local_148,&local_168,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_58,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pLVar5 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x5c;
          local_78._M_string_length = 0x4de06c;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
          ;
          source_file._M_len = 0x5c;
          str._M_str = local_58._M_dataplus._M_p;
          str._M_len = local_58._M_string_length;
          logging_function._M_str = "LockDirectory";
          logging_function._M_len = 0xd;
          BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x47,ALL,Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (local_148[0] != local_138) {
          operator_delete(local_148[0],local_138[0] + 1);
        }
        LVar6 = ErrorLock;
      }
      std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>::~unique_ptr
                ((unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_> *)
                 local_188);
    }
  }
  std::filesystem::__cxx11::path::~path(local_100);
  std::unique_lock<std::mutex>::~unique_lock(&local_178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return LVar6;
  }
  __stack_chk_fail();
}

Assistant:

LockResult LockDirectory(const fs::path& directory, const fs::path& lockfile_name, bool probe_only)
{
    LOCK(cs_dir_locks);
    fs::path pathLockFile = directory / lockfile_name;

    // If a lock for this directory already exists in the map, don't try to re-lock it
    if (dir_locks.count(fs::PathToString(pathLockFile))) {
        return LockResult::Success;
    }

    // Create empty lock file if it doesn't exist.
    if (auto created{fsbridge::fopen(pathLockFile, "a")}) {
        std::fclose(created);
    } else {
        return LockResult::ErrorWrite;
    }
    auto lock = std::make_unique<fsbridge::FileLock>(pathLockFile);
    if (!lock->TryLock()) {
        LogError("Error while attempting to lock directory %s: %s\n", fs::PathToString(directory), lock->GetReason());
        return LockResult::ErrorLock;
    }
    if (!probe_only) {
        // Lock successful and we're not just probing, put it into the map
        dir_locks.emplace(fs::PathToString(pathLockFile), std::move(lock));
    }
    return LockResult::Success;
}